

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitCommonExpr(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                *this,CommonExpr e)

{
  BasicStringRef<char> value;
  int in_EDX;
  ExprBase in_RSI;
  BasicWriter<char> *in_RDI;
  size_t unaff_retaddr;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  BasicStringRef<char> *this_00;
  
  this_00 = (BasicStringRef<char> *)&in_RDI[1].buffer_;
  Reference::index((Reference *)&stack0xfffffffffffffff8,(char *)in_RSI.impl_,in_EDX);
  BasicProblem<mp::BasicProblemParams<int>>::VarNamer::dvname_abi_cxx11_
            ((VarNamer *)this_00,in_stack_ffffffffffffffcc);
  fmt::BasicStringRef<char>::BasicStringRef
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  value.size_ = unaff_retaddr;
  value.data_ = (char *)in_RSI.impl_;
  fmt::BasicWriter<char>::operator<<(in_RDI,value);
  return;
}

Assistant:

void VisitCommonExpr(CommonExpr e)
  { writer_ << vnam_.dvname(e.index()); }